

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall
QMdiAreaPrivate::_q_processWindowStateChanged
          (QMdiAreaPrivate *this,WindowStates oldState,WindowStates newState)

{
  bool bVar1;
  Int IVar2;
  QMdiAreaPrivate *this_00;
  QMdiSubWindow *pQVar3;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QMdiArea *q;
  WindowState in_stack_ffffffffffffff9c;
  WindowState WVar4;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QMdiAreaPrivate *this_01;
  undefined4 in_stack_ffffffffffffffc8;
  QFlagsStorage<Qt::WindowState> in_stack_ffffffffffffffcc;
  QFlagsStorageHelper<Qt::WindowState,_4> local_30;
  QFlagsStorageHelper<Qt::WindowState,_4> local_2c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_28;
  QFlagsStorageHelper<Qt::WindowState,_4> local_24;
  QFlagsStorageHelper<Qt::WindowState,_4> local_20;
  QFlagsStorageHelper<Qt::WindowState,_4> local_1c;
  QFlagsStorageHelper<Qt::WindowState,_4> local_18;
  QFlagsStorageHelper<Qt::WindowState,_4> local_14 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->ignoreWindowStateChange & 1U) == 0) {
    this_01 = in_RDI;
    this_00 = (QMdiAreaPrivate *)q_func(in_RDI);
    QObject::sender();
    pQVar3 = qobject_cast<QMdiSubWindow*>((QObject *)0x60e47c);
    if (pQVar3 != (QMdiSubWindow *)0x0) {
      local_14[0].super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)
           QFlags<Qt::WindowState>::operator&
                     ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff9c);
      bVar1 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)local_14);
      in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
      if (bVar1) {
        local_18.super_QFlagsStorage<Qt::WindowState>.i =
             (QFlagsStorage<Qt::WindowState>)
             QFlags<Qt::WindowState>::operator&
                       ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff9c);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
        in_stack_ffffffffffffff9c = CONCAT13(IVar2 != 0,(int3)in_stack_ffffffffffffff9c);
      }
      if ((char)(in_stack_ffffffffffffff9c >> 0x18) == '\0') {
        local_1c.super_QFlagsStorage<Qt::WindowState>.i =
             (QFlagsStorage<Qt::WindowState>)
             QFlags<Qt::WindowState>::operator&
                       ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff9c);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
        in_stack_ffffffffffffff9c =
             CONCAT13((char)(in_stack_ffffffffffffff9c >> 0x18),
                      (uint3)(ushort)in_stack_ffffffffffffff9c);
        if (IVar2 != 0) {
          local_20.super_QFlagsStorage<Qt::WindowState>.i =
               (QFlagsStorage<Qt::WindowState>)
               QFlags<Qt::WindowState>::operator&
                         ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff9c);
          bVar1 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_20);
          in_stack_ffffffffffffff9c =
               CONCAT13((char)(in_stack_ffffffffffffff9c >> 0x18),
                        CONCAT12(bVar1,(short)in_stack_ffffffffffffff9c));
        }
        if ((char)(in_stack_ffffffffffffff9c >> 0x10) != '\0') {
          resetActiveWindow(in_RDI,(QMdiSubWindow *)
                                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8.i));
        }
      }
      else {
        emitWindowActivated(this_00,(QMdiSubWindow *)
                                    CONCAT44(in_stack_ffffffffffffffcc.i,in_stack_ffffffffffffffc8))
        ;
      }
      local_24.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)
           QFlags<Qt::WindowState>::operator&
                     ((QFlags<Qt::WindowState> *)in_RDI,in_stack_ffffffffffffff9c);
      bVar1 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_24);
      WVar4 = CONCAT22((short)(in_stack_ffffffffffffff9c >> 0x10),
                       (ushort)(byte)in_stack_ffffffffffffff9c);
      if (bVar1) {
        local_28.super_QFlagsStorage<Qt::WindowState>.i =
             (QFlagsStorage<Qt::WindowState>)
             QFlags<Qt::WindowState>::operator&((QFlags<Qt::WindowState> *)in_RDI,WVar4);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
        WVar4 = CONCAT22((short)(WVar4 >> 0x10),CONCAT11(IVar2 != 0,(char)WVar4));
      }
      if ((char)(WVar4 >> 8) == '\0') {
        local_2c.super_QFlagsStorage<Qt::WindowState>.i =
             (QFlagsStorage<Qt::WindowState>)
             QFlags<Qt::WindowState>::operator&((QFlags<Qt::WindowState> *)in_RDI,WVar4);
        bVar1 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_2c);
        WVar4 = WVar4 & 0xffffff00;
        if (bVar1) {
          local_30.super_QFlagsStorage<Qt::WindowState>.i =
               (QFlagsStorage<Qt::WindowState>)
               QFlags<Qt::WindowState>::operator&((QFlags<Qt::WindowState> *)in_RDI,WVar4);
          IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
          WVar4 = CONCAT31((int3)(WVar4 >> 8),IVar2 != 0);
        }
        if ((char)WVar4 == '\0') {
          Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
          QFlags<Qt::WindowState>::operator&
                    ((QFlags<Qt::WindowState> *)in_RDI,
                     (QFlags<Qt::WindowState>)in_stack_ffffffffffffffa8.i);
          bVar1 = QFlags<Qt::WindowState>::operator!
                            ((QFlags<Qt::WindowState> *)&stack0xffffffffffffffcc);
          if (bVar1) {
            internalRaise(this_01,(QMdiSubWindow *)this_00);
            QFlags<Qt::WindowState>::operator&((QFlags<Qt::WindowState> *)in_RDI,WVar4);
            IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffc8);
            if (IVar2 != 0) {
              arrangeMinimizedSubWindows(in_RDI);
            }
          }
        }
        else {
          internalRaise(this_01,(QMdiSubWindow *)this_00);
        }
      }
      else {
        in_RDI->isSubWindowsTiled = false;
        arrangeMinimizedSubWindows(in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::_q_processWindowStateChanged(Qt::WindowStates oldState,
                                                   Qt::WindowStates newState)
{
    if (ignoreWindowStateChange)
        return;

    Q_Q(QMdiArea);
    QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(q->sender());
    if (!child)
        return;

    // windowActivated
    if (!(oldState & Qt::WindowActive) && (newState & Qt::WindowActive))
        emitWindowActivated(child);
    // windowDeactivated
    else if ((oldState & Qt::WindowActive) && !(newState & Qt::WindowActive))
        resetActiveWindow(child);

    // windowMinimized
    if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized)) {
        isSubWindowsTiled = false;
        arrangeMinimizedSubWindows();
    // windowMaximized
    } else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized)) {
        internalRaise(child);
    // windowRestored
    } else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized))) {
        internalRaise(child);
        if (oldState & Qt::WindowMinimized)
            arrangeMinimizedSubWindows();
    }
}